

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

uint8_t * __thiscall
edition_unittest::TestFieldOrderings_NestedMessage::_InternalSerialize
          (TestFieldOrderings_NestedMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong uVar1;
  anon_union_24_1_493b367e_for_TestFieldOrderings_NestedMessage_3 aVar2;
  uint8_t *puVar3;
  
  aVar2 = this->field_0;
  if (((undefined1  [24])aVar2 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.bb_,target);
  }
  if (((undefined1  [24])aVar2 & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<2>
                       (stream,(this->field_0)._impl_.oo_,target);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestFieldOrderings_NestedMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestFieldOrderings_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestFieldOrderings.NestedMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 bb = 1;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_bb(), target);
  }

  // int64 oo = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<2>(
            stream, this_._internal_oo(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestFieldOrderings.NestedMessage)
  return target;
}